

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O1

void __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::PrettyPrefix(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *this,Type type)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  char cVar6;
  size_t count;
  bool bVar7;
  
  pcVar2 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.stackTop_;
  pcVar4 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.stack_;
  if (pcVar2 == pcVar4) {
    if ((this->
        super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
        ).hasRoot_ != true) {
      (this->
      super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ).hasRoot_ = true;
      return;
    }
    __assert_fail("!Base::hasRoot_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/prettywriter.h"
                  ,0xf7,
                  "void rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::PrettyPrefix(Type) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                 );
  }
  if ((ulong)((long)pcVar2 - (long)pcVar4) < 0x10) {
    __assert_fail("GetSize() >= sizeof(T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/internal/stack.h"
                  ,0x91,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::Level]"
                 );
  }
  uVar3 = *(ulong *)(pcVar2 + -0x10);
  if (pcVar2[-8] == '\x01') {
    if (uVar3 != 0) {
      pcVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                         (&((this->
                            super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                            ).os_)->stack_,1);
      *pcVar4 = ',';
      if ((this->formatOptions_ & kFormatSingleLineArray) != kFormatDefault) {
        pcVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                           (&((this->
                              super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                              ).os_)->stack_,1);
        *pcVar4 = ' ';
      }
    }
    if ((this->formatOptions_ & kFormatSingleLineArray) != kFormatDefault) goto LAB_0036c289;
    pcVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                       (&((this->
                          super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                          ).os_)->stack_,1);
    *pcVar4 = '\n';
  }
  else {
    if (uVar3 == 0) {
      cVar6 = '\n';
    }
    else {
      pcVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                         (&((this->
                            super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                            ).os_)->stack_,1);
      bVar7 = (uVar3 & 1) == 0;
      cVar5 = ':';
      if (bVar7) {
        cVar5 = ',';
      }
      cVar6 = ' ';
      if (bVar7) {
        cVar6 = '\n';
      }
      *pcVar4 = cVar5;
    }
    pcVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                       (&((this->
                          super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                          ).os_)->stack_,1);
    *pcVar4 = cVar6;
    if ((pcVar2[-0x10] & 1U) != 0) goto LAB_0036c289;
  }
  count = (ulong)this->indentCharCount_ *
          ((ulong)((long)(this->
                         super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                         ).level_stack_.stackTop_ -
                  (long)(this->
                        super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        ).level_stack_.stack_) >> 4);
  bVar1 = (this->
          super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ).field_0x3d;
  pcVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                     (&((this->
                        super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        ).os_)->stack_,count);
  memset(pcVar4,(uint)bVar1,count);
LAB_0036c289:
  if (((pcVar2[-8] == '\0') && (type != kStringType)) && ((*(ulong *)(pcVar2 + -0x10) & 1) == 0)) {
    __assert_fail("type == kStringType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/prettywriter.h"
                  ,0xf3,
                  "void rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::PrettyPrefix(Type) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                 );
  }
  *(long *)(pcVar2 + -0x10) = *(long *)(pcVar2 + -0x10) + 1;
  return;
}

Assistant:

void PrettyPrefix(Type type) {
        (void)type;
        if (Base::level_stack_.GetSize() != 0) { // this value is not at root
            typename Base::Level* level = Base::level_stack_.template Top<typename Base::Level>();

            if (level->inArray) {
                if (level->valueCount > 0) {
                    Base::os_->Put(','); // add comma if it is not the first element in array
                    if (formatOptions_ & kFormatSingleLineArray)
                        Base::os_->Put(' ');
                }

                if (!(formatOptions_ & kFormatSingleLineArray)) {
                    Base::os_->Put('\n');
                    WriteIndent();
                }
            }
            else {  // in object
                if (level->valueCount > 0) {
                    if (level->valueCount % 2 == 0) {
                        Base::os_->Put(',');
                        Base::os_->Put('\n');
                    }
                    else {
                        Base::os_->Put(':');
                        Base::os_->Put(' ');
                    }
                }
                else
                    Base::os_->Put('\n');

                if (level->valueCount % 2 == 0)
                    WriteIndent();
            }
            if (!level->inArray && level->valueCount % 2 == 0)
                RAPIDJSON_ASSERT(type == kStringType);  // if it's in object, then even number should be a name
            level->valueCount++;
        }
        else {
            RAPIDJSON_ASSERT(!Base::hasRoot_);  // Should only has one and only one root.
            Base::hasRoot_ = true;
        }
    }